

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_1c0a25::SymlinkCommand::configureAttribute
          (SymlinkCommand *this,ConfigureContext *ctx,StringRef name,StringRef value)

{
  char *LHS;
  int *piVar1;
  size_t sVar2;
  string *this_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Child local_78;
  undefined8 uStack_70;
  Child local_68 [2];
  Child local_58;
  NodeKind local_48;
  char cStack_47;
  undefined6 uStack_46;
  Child local_40;
  NodeKind local_30;
  char cStack_2f;
  undefined6 uStack_2e;
  StringRef local_28;
  
  sVar2 = value.Length;
  piVar1 = (int *)value.Data;
  local_28.Length = name.Length;
  local_28.Data = name.Data;
  if (local_28.Length == 0x1d) {
    auVar5[0] = -(*(char *)((long)local_28.Data + 0xd) == 'n');
    auVar5[1] = -(*(char *)((long)local_28.Data + 0xe) == 'e');
    auVar5[2] = -(*(char *)((long)local_28.Data + 0xf) == 'r');
    auVar5[3] = -((char)*(long *)((long)local_28.Data + 0x10) == 's');
    auVar5[4] = -(*(char *)((long)local_28.Data + 0x11) == 'h');
    auVar5[5] = -(*(char *)((long)local_28.Data + 0x12) == 'i');
    auVar5[6] = -(*(char *)((long)local_28.Data + 0x13) == 'p');
    auVar5[7] = -(*(char *)((long)local_28.Data + 0x14) == '-');
    auVar5[8] = -(*(char *)((long)local_28.Data + 0x15) == 'a');
    auVar5[9] = -(*(char *)((long)local_28.Data + 0x16) == 'n');
    auVar5[10] = -(*(char *)((long)local_28.Data + 0x17) == 'a');
    auVar5[0xb] = -((char)*(long *)((long)local_28.Data + 0x18) == 'l');
    auVar5[0xc] = -(*(char *)((long)local_28.Data + 0x19) == 'y');
    auVar5[0xd] = -(*(char *)((long)local_28.Data + 0x1a) == 's');
    auVar5[0xe] = -(*(char *)((long)local_28.Data + 0x1b) == 'i');
    auVar5[0xf] = -(*(char *)((long)local_28.Data + 0x1c) == 's');
    auVar4[0] = -((char)*(long *)local_28.Data == 'r');
    auVar4[1] = -(*(char *)((long)local_28.Data + 1) == 'e');
    auVar4[2] = -(*(char *)((long)local_28.Data + 2) == 'p');
    auVar4[3] = -(*(char *)((long)local_28.Data + 3) == 'a');
    auVar4[4] = -(*(char *)((long)local_28.Data + 4) == 'i');
    auVar4[5] = -(*(char *)((long)local_28.Data + 5) == 'r');
    auVar4[6] = -(*(char *)((long)local_28.Data + 6) == '-');
    auVar4[7] = -(*(char *)((long)local_28.Data + 7) == 'v');
    auVar4[8] = -((char)*(long *)((long)local_28.Data + 8) == 'i');
    auVar4[9] = -(*(char *)((long)local_28.Data + 9) == 'a');
    auVar4[10] = -(*(char *)((long)local_28.Data + 10) == '-');
    auVar4[0xb] = -(*(char *)((long)local_28.Data + 0xb) == 'o');
    auVar4[0xc] = -(*(char *)((long)local_28.Data + 0xc) == 'w');
    auVar4[0xd] = -(*(char *)((long)local_28.Data + 0xd) == 'n');
    auVar4[0xe] = -(*(char *)((long)local_28.Data + 0xe) == 'e');
    auVar4[0xf] = -(*(char *)((long)local_28.Data + 0xf) == 'r');
    auVar4 = auVar4 & auVar5;
    if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) == 0xffff) {
      if (sVar2 == 5) {
        if ((char)piVar1[1] == 'e' && *piVar1 == 0x736c6166) {
          (this->super_Command).repairViaOwnershipAnalysis = false;
          return true;
        }
      }
      else if ((sVar2 == 4) && (*piVar1 == 0x65757274)) {
        (this->super_Command).repairViaOwnershipAnalysis = true;
        return true;
      }
      LHS = "invalid value for attribute: \'";
      goto LAB_0015defa;
    }
  }
  else if (local_28.Length == 0x10) {
    auVar3[0] = -((char)*(long *)local_28.Data == 'l');
    auVar3[1] = -(*(char *)((long)local_28.Data + 1) == 'i');
    auVar3[2] = -(*(char *)((long)local_28.Data + 2) == 'n');
    auVar3[3] = -(*(char *)((long)local_28.Data + 3) == 'k');
    auVar3[4] = -(*(char *)((long)local_28.Data + 4) == '-');
    auVar3[5] = -(*(char *)((long)local_28.Data + 5) == 'o');
    auVar3[6] = -(*(char *)((long)local_28.Data + 6) == 'u');
    auVar3[7] = -(*(char *)((long)local_28.Data + 7) == 't');
    auVar3[8] = -((char)*(long *)((long)local_28.Data + 8) == 'p');
    auVar3[9] = -(*(char *)((long)local_28.Data + 9) == 'u');
    auVar3[10] = -(*(char *)((long)local_28.Data + 10) == 't');
    auVar3[0xb] = -(*(char *)((long)local_28.Data + 0xb) == '-');
    auVar3[0xc] = -(*(char *)((long)local_28.Data + 0xc) == 'p');
    auVar3[0xd] = -(*(char *)((long)local_28.Data + 0xd) == 'a');
    auVar3[0xe] = -(*(char *)((long)local_28.Data + 0xe) == 't');
    auVar3[0xf] = -(*(char *)((long)local_28.Data + 0xf) == 'h');
    if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe | (ushort)(auVar3[0xf] >> 7) << 0xf)
        == 0xffff) {
      local_78.twine = (Twine *)local_68;
      if (piVar1 == (int *)0x0) {
        uStack_70 = 0;
        local_68[0].twine = (Twine *)((ulong)(uint7)local_68[0]._1_7_ << 8);
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,piVar1,sVar2 + (long)piVar1);
      }
      this_00 = (string *)&this->linkOutputPath;
      goto LAB_0015e012;
    }
  }
  else if ((local_28.Length == 8) && (*(long *)local_28.Data == 0x73746e65746e6f63)) {
    local_78.twine = (Twine *)local_68;
    if (piVar1 == (int *)0x0) {
      uStack_70 = 0;
      local_68[0].twine = (Twine *)((ulong)(uint7)local_68[0]._1_7_ << 8);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,piVar1,sVar2 + (long)piVar1);
    }
    this_00 = (string *)&this->contents;
LAB_0015e012:
    std::__cxx11::string::operator=(this_00,(string *)&local_78.character);
    if (&(local_78.twine)->LHS != local_68) {
      operator_delete(local_78.twine,(ulong)((long)&(local_68[0].twine)->LHS + 1));
    }
    return true;
  }
  LHS = "unexpected attribute: \'";
LAB_0015defa:
  llvm::Twine::Twine((Twine *)&local_40,LHS,&local_28);
  llvm::Twine::Twine((Twine *)&local_58,"\'");
  if ((local_30 == NullKind) || (local_48 == NullKind)) {
    local_68[0].decUI._0_2_ = 0x100;
  }
  else if (local_30 == EmptyKind) {
    local_68[0].decUI._1_1_ = cStack_47;
    local_68[0].character = local_48;
    local_68[0]._2_6_ = uStack_46;
  }
  else if (local_48 == EmptyKind) {
    local_68[0].decUI._1_1_ = cStack_2f;
    local_68[0].character = local_30;
    local_68[0]._2_6_ = uStack_2e;
  }
  else {
    if (cStack_2f != '\x01') {
      local_30 = TwineKind;
      local_40.twine = (Twine *)&local_40;
    }
    if (cStack_47 != '\x01') {
      local_48 = TwineKind;
      local_58.twine = (Twine *)&local_58;
    }
    llvm::Twine::Twine((Twine *)&local_78,local_40,local_30,local_58,local_48);
  }
  llbuild::buildsystem::ConfigureContext::error(ctx,(Twine *)&local_78);
  return false;
}

Assistant:

virtual bool configureAttribute(const ConfigureContext& ctx, StringRef name,
                                  StringRef value) override {
    if (name == "contents") {
      contents = value;
      return true;
    } else if (name == "link-output-path") {
      linkOutputPath = value;
      return true;
    } else if (name == "repair-via-ownership-analysis") {
      if (value == "true") {
        repairViaOwnershipAnalysis = true;
        return true;
      } else if (value == "false") {
        repairViaOwnershipAnalysis = false;
        return true;
      } else {
        ctx.error("invalid value for attribute: '" + name + "'");
        return false;
      }
    } else {
      ctx.error("unexpected attribute: '" + name + "'");
      return false;
    }
  }